

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

uint hash(char *p)

{
  char *pcVar1;
  uint local_18;
  uint h;
  uint g;
  char *p_local;
  
  local_18 = 0;
  _h = p;
  while (*_h != '\0') {
    pcVar1 = _h + 1;
    local_18 = local_18 * 0x10 + (int)*_h;
    _h = pcVar1;
    if ((local_18 & 0xf0000000) != 0) {
      local_18 = ((local_18 & 0xf0000000) >> 0x18 ^ local_18) & 0xfffffff;
    }
  }
  return local_18;
}

Assistant:

static unsigned int
hash(const char *p)
{
	/* A 32-bit version of Peter Weinberger's (PJW) hash algorithm,
	   as used by ELF for hashing function names. */
	unsigned g, h = 0;
	while (*p != '\0') {
		h = (h << 4) + *p++;
		if ((g = h & 0xF0000000) != 0) {
			h ^= g >> 24;
			h &= 0x0FFFFFFF;
		}
	}
	return h;
}